

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::PeriodicDelaunay3d::get_incident_tets(PeriodicDelaunay3d *this,index_t v,IncidentTetrahedra *W)

{
  vector<unsigned_int> *this_00;
  iterator iVar1;
  uint *puVar2;
  pointer piVar3;
  vector<int> *pvVar4;
  _Elt_pointer puVar5;
  index_t iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  index_t neigh;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  this_00 = &W->incident_tets_set;
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::resize
            (&this_00->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
             ,0);
  uVar11 = *(uint *)&(this->super_Delaunay).field_0xf4;
  if (v < uVar11) {
    pvVar4 = &(this->super_Delaunay).v_to_cell_;
    iVar6 = v;
  }
  else {
    uVar9 = ~(-1 << ((byte)(v / uVar11) & 0x1f)) &
            (this->vertex_instances_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start[(ulong)v % (ulong)uVar11];
    uVar9 = uVar9 - (uVar9 >> 1 & 0x15555555);
    uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
    pvVar4 = (vector<int> *)&this->periodic_v_to_cell_data_;
    iVar6 = ((this->periodic_v_to_cell_rowptr_).
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start[(ulong)v % (ulong)uVar11] +
            (((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18)) - 1;
  }
  local_38 = (pvVar4->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6];
  if (local_38 != 0xffffffff) {
    iVar1._M_current =
         (W->incident_tets_set).
         super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
         super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl
         .super__Vector_impl_data._M_finish;
    local_34 = local_38;
    if (iVar1._M_current ==
        (W->incident_tets_set).
        super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>> *)this_00,
                 iVar1,&local_34);
    }
    else {
      *iVar1._M_current = local_38;
      (W->incident_tets_set).
      super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    puVar2 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
                ((deque<unsigned_int,std::allocator<unsigned_int>> *)W,&local_38);
    }
    else {
      *puVar2 = local_38;
      (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = puVar2 + 1;
    }
    puVar5 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar5 != (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      do {
        if (puVar5 == (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar5 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        local_38 = puVar5[-1];
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)W);
        uVar7 = (ulong)(local_38 * 4);
        piVar3 = (this->cell_to_v_store_).
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (uint)(piVar3[uVar7 + 3] == v) * 3 |
                 (uint)(piVar3[uVar7 + 1] == v) + (uint)(piVar3[uVar7 + 2] == v) * 2;
        local_3c = (this->cell_to_cell_store_).
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start[(uVar11 + 1 & 3) + local_38 * 4];
        if (local_3c != 0xffffffff) {
          puVar2 = (W->incident_tets_set).
                   super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                   super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar1._M_current =
               (W->incident_tets_set).
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar12 = ((long)iVar1._M_current - (long)puVar2 & 0x3fffffffcU) != 0;
          if ((bVar12) && (*puVar2 != local_3c)) {
            uVar8 = (ulong)((long)iVar1._M_current - (long)puVar2) >> 2 & 0xffffffff;
            uVar7 = 1;
            do {
              uVar10 = uVar7;
              if (uVar8 == uVar10) break;
              uVar7 = uVar10 + 1;
            } while (puVar2[uVar10] != local_3c);
            bVar12 = uVar10 < uVar8;
          }
          if (!bVar12) {
            local_34 = local_3c;
            if (iVar1._M_current ==
                (W->incident_tets_set).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>> *)
                         this_00,iVar1,&local_34);
            }
            else {
              *iVar1._M_current = local_3c;
              (W->incident_tets_set).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            puVar2 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Deque_impl_data._M_finish._M_cur;
            if (puVar2 == (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_int,std::allocator<unsigned_int>>::
              _M_push_back_aux<unsigned_int_const&>
                        ((deque<unsigned_int,std::allocator<unsigned_int>> *)W,&local_3c);
            }
            else {
              *puVar2 = local_3c;
              (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar2 + 1;
            }
          }
        }
        local_3c = (this->cell_to_cell_store_).
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11 + local_38 * 4 ^ 2];
        if (local_3c != 0xffffffff) {
          puVar2 = (W->incident_tets_set).
                   super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                   super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar1._M_current =
               (W->incident_tets_set).
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar12 = ((long)iVar1._M_current - (long)puVar2 & 0x3fffffffcU) != 0;
          if ((bVar12) && (*puVar2 != local_3c)) {
            uVar8 = (ulong)((long)iVar1._M_current - (long)puVar2) >> 2 & 0xffffffff;
            uVar7 = 1;
            do {
              uVar10 = uVar7;
              if (uVar8 == uVar10) break;
              uVar7 = uVar10 + 1;
            } while (puVar2[uVar10] != local_3c);
            bVar12 = uVar10 < uVar8;
          }
          if (!bVar12) {
            local_34 = local_3c;
            if (iVar1._M_current ==
                (W->incident_tets_set).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>> *)
                         this_00,iVar1,&local_34);
            }
            else {
              *iVar1._M_current = local_3c;
              (W->incident_tets_set).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            puVar2 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Deque_impl_data._M_finish._M_cur;
            if (puVar2 == (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_int,std::allocator<unsigned_int>>::
              _M_push_back_aux<unsigned_int_const&>
                        ((deque<unsigned_int,std::allocator<unsigned_int>> *)W,&local_3c);
            }
            else {
              *puVar2 = local_3c;
              (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar2 + 1;
            }
          }
        }
        local_3c = (this->cell_to_cell_store_).
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start[(uVar11 - 1 & 3) + local_38 * 4];
        if (local_3c != 0xffffffff) {
          puVar2 = (W->incident_tets_set).
                   super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                   super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar1._M_current =
               (W->incident_tets_set).
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar12 = ((long)iVar1._M_current - (long)puVar2 & 0x3fffffffcU) != 0;
          if ((bVar12) && (*puVar2 != local_3c)) {
            uVar8 = (ulong)((long)iVar1._M_current - (long)puVar2) >> 2 & 0xffffffff;
            uVar7 = 1;
            do {
              uVar10 = uVar7;
              if (uVar8 == uVar10) break;
              uVar7 = uVar10 + 1;
            } while (puVar2[uVar10] != local_3c);
            bVar12 = uVar10 < uVar8;
          }
          if (!bVar12) {
            local_34 = local_3c;
            if (iVar1._M_current ==
                (W->incident_tets_set).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>> *)
                         this_00,iVar1,&local_34);
            }
            else {
              *iVar1._M_current = local_3c;
              (W->incident_tets_set).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            puVar2 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Deque_impl_data._M_finish._M_cur;
            if (puVar2 == (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<unsigned_int,std::allocator<unsigned_int>>::
              _M_push_back_aux<unsigned_int_const&>
                        ((deque<unsigned_int,std::allocator<unsigned_int>> *)W,&local_3c);
            }
            else {
              *puVar2 = local_3c;
              (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur = puVar2 + 1;
            }
          }
        }
        puVar5 = (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
      } while (puVar5 != (W->S).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur);
    }
  }
  return;
}

Assistant:

void PeriodicDelaunay3d::get_incident_tets(
	index_t v, IncidentTetrahedra& W
    ) const {

	geo_debug_assert(
	    periodic_ || v < nb_vertices_non_periodic_
	);

	W.clear_incident_tets();

	index_t t = index_t(-1);
	if(v < nb_vertices_non_periodic_) {
	    t = index_t(v_to_cell_[v]);
	} else {
	    index_t v_real = periodic_vertex_real(v);
	    index_t v_instance = periodic_vertex_instance(v);
	    
	    geo_debug_assert(
		(vertex_instances_[v_real] & (1u << v_instance))!=0
	    );

	    index_t slot = pop_count(
		vertex_instances_[v_real] & ((1u << v_instance)-1)
	    ) - 1;

	    t = periodic_v_to_cell_data_[
		periodic_v_to_cell_rowptr_[v_real] + slot
	    ];
	}
	
	// Can happen: empty power cell.
	if(t == index_t(-1)) {
	    return;
	}

	// TODO: different version if CICL is stored ?
	{
	    W.add_incident_tet(t);
	    W.S.push(t);
	    while(!W.S.empty()) {
		t = W.S.top();
		W.S.pop();
		const signed_index_t* T = &(cell_to_v_store_[4 * t]);
		index_t lv = PeriodicDelaunay3dThread::find_4(
		    T,signed_index_t(v)
		);
		index_t neigh = index_t(cell_to_cell_store_[4*t + (lv + 1)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
		neigh = index_t(cell_to_cell_store_[4*t + (lv + 2)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
		neigh = index_t(cell_to_cell_store_[4*t + (lv + 3)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
	    }
	}
    }